

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O3

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
treeEditDist(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
             *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2,int it1subtree,int it2subtree,
            Matrix<double> *forestdist,bool treesSwapped)

{
  size_t row;
  longlong *plVar1;
  size_t col;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  double *pdVar13;
  int *piVar14;
  pointer piVar15;
  long lVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  pointer piVar20;
  size_t sVar21;
  long lVar22;
  size_t col_00;
  long lVar23;
  uint uVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  
  iVar6 = (t1->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it1subtree];
  iVar7 = (t2->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it2subtree];
  iVar8 = (t1->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[iVar6];
  iVar9 = (t2->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[iVar7];
  pdVar13 = data_structures::Matrix<double>::at(forestdist,0,0);
  *pdVar13 = 0.0;
  if (iVar8 <= iVar6) {
    sVar21 = 1;
    do {
      pdVar13 = data_structures::Matrix<double>::read_at(forestdist,sVar21 - 1,0);
      dVar25 = *pdVar13;
      pdVar13 = data_structures::Matrix<double>::at(forestdist,sVar21,0);
      *pdVar13 = dVar25 + 1.0;
      sVar21 = sVar21 + 1;
    } while ((iVar6 - iVar8) + 2 != sVar21);
  }
  if (iVar9 <= iVar7) {
    sVar21 = 1;
    do {
      pdVar13 = data_structures::Matrix<double>::read_at(forestdist,0,sVar21 - 1);
      dVar25 = *pdVar13;
      pdVar13 = data_structures::Matrix<double>::at(forestdist,0,sVar21);
      *pdVar13 = dVar25 + 1.0;
      sVar21 = sVar21 + 1;
    } while ((iVar7 - iVar9) + 2 != sVar21);
  }
  if (iVar8 <= iVar6) {
    lVar16 = (long)(iVar9 + -1);
    sVar21 = 1;
    do {
      if (iVar9 <= iVar7) {
        lVar2 = (long)iVar8 + -1 + sVar21;
        row = sVar21 - 1;
        col_00 = 1;
        lVar23 = lVar16 * 4;
        do {
          lVar23 = lVar23 + 4;
          plVar1 = &(this->
                    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                    ).subproblem_counter_;
          *plVar1 = *plVar1 + 1;
          piVar14 = (t1->super_PostLToLabelId).postl_to_label_id_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + lVar2;
          piVar17 = (int *)((long)(t2->super_PostLToLabelId).postl_to_label_id_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar23);
          piVar18 = piVar17;
          if (!treesSwapped) {
            piVar18 = piVar14;
            piVar14 = piVar17;
          }
          dVar25 = 0.0;
          if (*piVar18 != *piVar14) {
            dVar25 = 1.0;
          }
          pdVar13 = data_structures::Matrix<double>::read_at(forestdist,row,col_00);
          dVar3 = *pdVar13;
          col = col_00 - 1;
          pdVar13 = data_structures::Matrix<double>::read_at(forestdist,sVar21,col);
          dVar4 = *pdVar13;
          piVar15 = (t1->super_PostLToLLD).postl_to_lld_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          iVar10 = piVar15[lVar2];
          piVar12 = (t2->super_PostLToLLD).postl_to_lld_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          if ((iVar10 == piVar15[iVar6]) && (piVar12[lVar16 + col_00] == piVar12[iVar7])) {
            pdVar13 = data_structures::Matrix<double>::read_at(forestdist,row,col);
            dVar26 = *pdVar13;
            pdVar13 = data_structures::Matrix<double>::read_at(forestdist,row,col);
            dVar5 = *pdVar13;
            if (treesSwapped) {
              iVar10 = (t2->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar16 + col_00];
              iVar11 = (t1->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar2];
            }
            else {
              iVar10 = (t1->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar2];
              iVar11 = (t2->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar16 + col_00];
            }
            pdVar13 = data_structures::Matrix<double>::at(&this->delta_,(long)iVar10,(long)iVar11);
            *pdVar13 = dVar5;
          }
          else {
            pdVar13 = data_structures::Matrix<double>::read_at
                                (forestdist,(long)(iVar10 - iVar8),
                                 (long)(piVar12[lVar16 + col_00] - iVar9));
            lVar19 = lVar2;
            if (treesSwapped) {
              lVar19 = lVar16 + col_00;
            }
            dVar26 = *pdVar13;
            lVar22 = lVar16 + col_00;
            if (treesSwapped) {
              lVar22 = lVar2;
            }
            piVar15 = (t2->super_PostLToPreL).postl_to_prel_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            piVar12 = (t1->super_PostLToPreL).postl_to_prel_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            piVar20 = piVar12;
            if (treesSwapped) {
              piVar20 = piVar15;
            }
            if (treesSwapped) {
              piVar15 = piVar12;
            }
            pdVar13 = data_structures::Matrix<double>::read_at
                                (&this->delta_,(long)piVar20[lVar19],(long)piVar15[lVar22]);
            dVar26 = dVar26 + *pdVar13;
          }
          uVar24 = -(uint)((float)(dVar4 + 1.0) <= (float)(dVar3 + 1.0));
          fVar27 = (float)(~uVar24 & (uint)(float)(dVar3 + 1.0) |
                          (uint)(float)(dVar4 + 1.0) & uVar24);
          uVar24 = -(uint)((float)(dVar25 + dVar26) <= fVar27);
          pdVar13 = data_structures::Matrix<double>::at(forestdist,sVar21,col_00);
          *pdVar13 = (double)(float)(uVar24 & (uint)(float)(dVar25 + dVar26) |
                                    ~uVar24 & (uint)fVar27);
          col_00 = col_00 + 1;
        } while ((iVar7 - iVar9) + 2 != col_00);
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != (iVar6 - iVar8) + 2);
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::treeEditDist(const TreeIndex& t1,
    const TreeIndex& t2, int it1subtree, int it2subtree,
    data_structures::Matrix<double>& forestdist, bool treesSwapped) {
  // Translate input subtree root nodes to left-to-right postorder.
  int i = t1.prel_to_postl_[it1subtree];
  int j = t2.prel_to_postl_[it2subtree];
  // We need to offset the node ids for accessing forestdist array which has
  // indices from 0 to subtree size. However, the subtree node indices do not
  // necessarily start with 0.
  // Whenever the original left-to-right postorder id has to be accessed, use
  // i+ioff and j+joff.
  int ioff = t1.postl_to_lld_[i] - 1;
  int joff = t2.postl_to_lld_[j] - 1;
  // Variables holding costs of each minimum element.
  float da = 0;
  float db = 0;
  float dc = 0;
  // Initialize forestdist array with deletion and insertion costs of each
  // relevant subforest.
  forestdist.at(0, 0) = 0;
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    forestdist.at(i1, 0) = forestdist.read_at(i1 - 1, 0) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
  }
  for (int j1 = 1; j1 <= j - joff; ++j1) {
    forestdist.at(0, j1) = forestdist.read_at(0, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
  }
  // Fill in the remaining costs.
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    for (int j1 = 1; j1 <= j - joff; ++j1) {
      // Increment the number of subproblems.
      ++subproblem_counter_;
      // Calculate partial distance values for this subproblem.
      double u = (treesSwapped ? c_.ren(t2.postl_to_label_id_[j1 + joff], t1.postl_to_label_id_[i1 + ioff]) : c_.ren(t1.postl_to_label_id_[i1 + ioff], t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - rename i1 to j1.
      da = forestdist.read_at(i1 - 1, j1) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
      db = forestdist.read_at(i1, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
      // If current subforests are subtrees.
      if (t1.postl_to_lld_[i1 + ioff] == t1.postl_to_lld_[i] && t2.postl_to_lld_[j1 + joff] == t2.postl_to_lld_[j]) {
        dc = forestdist.read_at(i1 - 1, j1 - 1) + u;
        // Store the relevant distance value in delta array.
        if (treesSwapped) {
          delta_.at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) = forestdist.read_at(i1 - 1, j1 - 1);
        } else {
          delta_.at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff]) = forestdist.read_at(i1 - 1, j1 - 1);
        }
      } else {
        dc = forestdist.read_at(t1.postl_to_lld_[i1 + ioff] - 1 - ioff, t2.postl_to_lld_[j1 + joff] - 1 - joff) +
          (treesSwapped ? delta_.read_at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) : delta_.read_at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff])) + u;
      }
      // Calculate final minimum.
      forestdist.at(i1, j1) = da >= db ? db >= dc ? dc : db : da >= dc ? dc : da;
    }
  }
}